

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O3

pair<_5a9a11fd_> __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::Hasher<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>,slang::Hasher<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>>>>
::
emplace<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const&,ska::flat_hash_map<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>,slang::Hasher<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>>>::convertible_to_value>
          (sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::Hasher<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>,slang::Hasher<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>>>>
           *this,tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                 *key,convertible_to_value *args)

{
  EntryPointer psVar1;
  bool bVar2;
  size_t sVar3;
  ulong uVar4;
  EntryPointer current_entry;
  char distance_from_desired;
  EntryPointer psVar5;
  pair<_5a9a11fd_> pVar6;
  hash<std::basic_string_view<char,_std::char_traits<char>_>_> hasher;
  hash<std::basic_string_view<char,_std::char_traits<char>_>_> local_29;
  
  sVar3 = std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                    (&local_29,
                     &(key->
                      super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                      ).
                      super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                      ._M_head_impl);
  uVar4 = sVar3 + 0x9e3779b9;
  current_entry =
       (EntryPointer)
       (*(long *)this +
       (((long)(key->
               super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
               ).super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
               super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl +
         (uVar4 >> 2) + uVar4 * 0x40 + 0x9e3779b9 ^ uVar4) * -0x61c8864680b583eb >>
       ((byte)this[0x10] & 0x3f)) * 0x28);
  if (current_entry->distance_from_desired < '\0') {
    distance_from_desired = '\0';
  }
  else {
    distance_from_desired = '\0';
    psVar5 = current_entry;
    do {
      bVar2 = std::
              __tuple_compare<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_0UL,_2UL>
              ::__eq(key,&(psVar5->field_1).value.first);
      if (bVar2) {
        pVar6._8_8_ = 0;
        pVar6.first.current = psVar5;
        return pVar6;
      }
      current_entry = psVar5 + 1;
      distance_from_desired = distance_from_desired + '\x01';
      psVar1 = psVar5 + 1;
      psVar5 = current_entry;
    } while (distance_from_desired <= psVar1->distance_from_desired);
  }
  pVar6 = emplace_new_key<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const&,ska::flat_hash_map<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>,slang::Hasher<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::unique_ptr<slang::ast::Definition,std::default_delete<slang::ast::Definition>>>>>::convertible_to_value>
                    (this,distance_from_desired,current_entry,key,args);
  return pVar6;
}

Assistant:

std::pair<iterator, bool> emplace(Key && key, Args &&... args)
    {
        size_t index = hash_policy.index_for_hash(hash_object(key), num_slots_minus_one);
        EntryPointer current_entry = entries + ptrdiff_t(index);
        int8_t distance_from_desired = 0;
        for (; current_entry->distance_from_desired >= distance_from_desired; ++current_entry, ++distance_from_desired)
        {
            if (compares_equal(key, current_entry->value))
                return { { current_entry }, false };
        }
        return emplace_new_key(distance_from_desired, current_entry, std::forward<Key>(key), std::forward<Args>(args)...);
    }